

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O2

void __thiscall opengv::math::Sturm::~Sturm(Sturm *this)

{
  ~Sturm(this);
  Eigen::internal::handmade_aligned_free(this);
  return;
}

Assistant:

void
opengv::math::Sturm::findRoots2( std::vector<double> & roots, double eps_x, double eps_val )
{
  double absoluteBound = computeLagrangianBound();
  std::list<Bracket::Ptr> stack;
  stack.push_back(Bracket::Ptr(new Bracket(-absoluteBound,absoluteBound)));
  stack.back()->setLowerBoundChanges( evaluateChain2(stack.back()->lowerBound()) );
  stack.back()->setUpperBoundChanges( evaluateChain2(stack.back()->upperBound()) );
  roots.reserve(stack.back()->numberRoots());
  
  //some variables for pollishing
  Eigen::MatrixXd monomials(_dimension,1);
  monomials(_dimension-1,0) = 1.0;
  
  while( !stack.empty() )
  {  
    Bracket::Ptr bracket = stack.front();
    stack.pop_front();
    
    if( bracket->dividable(eps_x) )
    {
      bool divide = true;
      
      if( bracket->numberRoots() == 1 )
      {
        //new part, we try immediately to do the pollishing here
        bool converged = false;
        
        double root = 0.5 * (bracket->lowerBound() + bracket->upperBound());
        for(size_t i = 2; i <= _dimension; i++)
          monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*root;
        Eigen::MatrixXd matValue = _C.row(0) * monomials;
        
        double value = matValue(0,0);
        
        while( !converged )
        {
          Eigen::MatrixXd matDerivative = _C.row(1) * monomials;
          double derivative = matDerivative(0,0);
          
          double newRoot = root - (value/derivative);
          
          if( newRoot < bracket->lowerBound() || newRoot > bracket->upperBound() )
            break;
          
          for(size_t i = 2; i <= _dimension; i++)
            monomials(_dimension-i,0) = monomials(_dimension-i+1,0)*newRoot;
          matValue = _C.row(0) * monomials;
          
          double newValue = matValue(0,0);
          
          if( fabs(newValue) > fabs(value) )
            break;
          
          //do update
          value = newValue;
          root = newRoot;
          
          //check if converged
          if( fabs(value) < eps_val )
            converged = true;
        }
        
        if( converged )
        {
          divide = false;
          roots.push_back(root);
        }
      }
      
      if(divide)
      {
        bracket->divide(stack);
        std::list<Bracket::Ptr>::iterator it = stack.end();
        it--;
        size_t changes = evaluateChain2((*it)->lowerBound());
        (*it)->setLowerBoundChanges(changes);
        it--;
        (*it)->setUpperBoundChanges(changes);
      }
    }
    else
    {
      if( bracket->numberRoots() > 0 )
        roots.push_back(0.5 * (bracket->lowerBound() + bracket->upperBound()));
    }
  }
}